

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

ZSTD_CDict *
ZSTD_initStaticCDict
          (void *workspace,size_t workspaceSize,void *dict,size_t dictSize,
          ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
          ZSTD_compressionParameters cParams)

{
  void *__dest;
  ZSTD_compressionParameters cParams_00;
  uint uVar1;
  size_t sVar2;
  long lVar3;
  ZSTD_CDict *pZVar4;
  void *pvVar5;
  
  sVar2 = ZSTD_sizeof_matchState(&cParams,0);
  pZVar4 = (ZSTD_CDict *)0x0;
  if (((ulong)workspace & 7) == 0) {
    lVar3 = dictSize + 0x2b00;
    if (dictLoadMethod == ZSTD_dlm_byRef) {
      lVar3 = 0x2b00;
    }
    if (workspaceSize < lVar3 + sVar2) {
      pZVar4 = (ZSTD_CDict *)0x0;
    }
    else {
      __dest = (void *)((long)workspace + 0x1300);
      pvVar5 = __dest;
      if (dictLoadMethod == ZSTD_dlm_byCopy) {
        memcpy(__dest,dict,dictSize);
        pvVar5 = (void *)((long)__dest + dictSize);
        dict = __dest;
      }
      *(void **)((long)workspace + 0x18) = pvVar5;
      *(size_t *)((long)workspace + 0x20) = sVar2 + 0x1800;
      cParams_00.hashLog = cParams.hashLog;
      cParams_00.windowLog = cParams.windowLog;
      cParams_00.chainLog = cParams.chainLog;
      cParams_00.searchLog = cParams.searchLog;
      cParams_00.searchLength = cParams.searchLength;
      cParams_00.targetLength = cParams.targetLength;
      cParams_00.strategy = cParams.strategy;
      sVar2 = ZSTD_initCDict_internal
                        ((ZSTD_CDict *)workspace,dict,dictSize,ZSTD_dlm_byRef,dictContentType,
                         cParams_00);
      uVar1 = ZSTD_isError(sVar2);
      pZVar4 = (ZSTD_CDict *)0x0;
      if (uVar1 == 0) {
        pZVar4 = (ZSTD_CDict *)workspace;
      }
    }
  }
  return pZVar4;
}

Assistant:

const ZSTD_CDict* ZSTD_initStaticCDict(
                                 void* workspace, size_t workspaceSize,
                           const void* dict, size_t dictSize,
                                 ZSTD_dictLoadMethod_e dictLoadMethod,
                                 ZSTD_dictContentType_e dictContentType,
                                 ZSTD_compressionParameters cParams)
{
    size_t const matchStateSize = ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 0);
    size_t const neededSize = sizeof(ZSTD_CDict) + (dictLoadMethod == ZSTD_dlm_byRef ? 0 : dictSize)
                            + HUF_WORKSPACE_SIZE + matchStateSize;
    ZSTD_CDict* const cdict = (ZSTD_CDict*) workspace;
    void* ptr;
    if ((size_t)workspace & 7) return NULL;  /* 8-aligned */
    DEBUGLOG(4, "(workspaceSize < neededSize) : (%u < %u) => %u",
        (U32)workspaceSize, (U32)neededSize, (U32)(workspaceSize < neededSize));
    if (workspaceSize < neededSize) return NULL;

    if (dictLoadMethod == ZSTD_dlm_byCopy) {
        memcpy(cdict+1, dict, dictSize);
        dict = cdict+1;
        ptr = (char*)workspace + sizeof(ZSTD_CDict) + dictSize;
    } else {
        ptr = cdict+1;
    }
    cdict->workspace = ptr;
    cdict->workspaceSize = HUF_WORKSPACE_SIZE + matchStateSize;

    if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                              dict, dictSize,
                                              ZSTD_dlm_byRef, dictContentType,
                                              cParams) ))
        return NULL;

    return cdict;
}